

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O1

String __thiscall doctest::detail::getStreamResult(detail *this,ostream *in)

{
  long *local_30;
  long local_20 [2];
  
  std::__cxx11::stringbuf::str();
  String::String((String *)this,(char *)local_30);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return (String)(char *)this;
}

Assistant:

String getStreamResult(std::ostream* in) {
        return static_cast<std::ostringstream*>(in)->str().c_str();
    }